

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall Catch::XmlWriter::startElement(XmlWriter *this,string *name)

{
  ostream *poVar1;
  
  ensureTagClosed(this);
  newlineIfNecessary(this);
  poVar1 = std::operator<<((ostream *)this->m_os,(string *)&this->m_indent);
  poVar1 = std::operator<<(poVar1,'<');
  std::operator<<(poVar1,(string *)name);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_tags,name);
  std::__cxx11::string::append((char *)&this->m_indent);
  this->m_tagIsOpen = true;
  return this;
}

Assistant:

XmlWriter& XmlWriter::startElement( std::string const& name ) {
        ensureTagClosed();
        newlineIfNecessary();
        m_os << m_indent << '<' << name;
        m_tags.push_back( name );
        m_indent += "  ";
        m_tagIsOpen = true;
        return *this;
    }